

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O0

char * GetConfigValue(char *devName,char *blockName,char *keyName,char *def)

{
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  __first;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  iter;
  string key;
  vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  *in_stack_ffffffffffffff50;
  FILE *__stream_00;
  undefined1 *__pred;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  local_60 [3];
  string local_48 [24];
  char *in_stack_ffffffffffffffd0;
  char *local_8;
  
  local_8 = in_RCX;
  if (in_RDX != (char *)0x0) {
    std::__cxx11::string::string(local_48);
    if ((in_RSI == (char *)0x0) || (iVar2 = al::strcasecmp(in_RSI,"general"), iVar2 == 0)) {
      if (in_RDI != (char *)0x0) {
        std::__cxx11::string::operator=(local_48,in_RDI);
        std::__cxx11::string::operator+=(local_48,'/');
      }
      std::__cxx11::string::operator+=(local_48,in_RDX);
    }
    else {
      std::__cxx11::string::operator=(local_48,in_RSI);
      if (in_RDI != (char *)0x0) {
        std::__cxx11::string::operator+=(local_48,'/');
        std::__cxx11::string::operator+=(local_48,in_RDI);
      }
      std::__cxx11::string::operator+=(local_48,'/');
      std::__cxx11::string::operator+=(local_48,in_RDX);
    }
    __pred = (anonymous_namespace)::ConfOpts;
    std::
    vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>
    ::cbegin(in_stack_ffffffffffffff48);
    std::
    vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>
    ::cend(in_stack_ffffffffffffff48);
    __first._M_current._4_4_ = in_stack_ffffffffffffff7c;
    __first._M_current._0_4_ = in_stack_ffffffffffffff78;
    local_60[0] = std::
                  find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ConfigEntry_const*,std::vector<(anonymous_namespace)::ConfigEntry,al::allocator<(anonymous_namespace)::ConfigEntry,8ul>>>,GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                            (__first,in_stack_ffffffffffffff70,
                             (anon_class_8_1_ba1d59bf_for__M_pred)__pred);
    std::
    vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>
    ::cend(in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
                        *)in_stack_ffffffffffffff48);
    __stream = gLogFile;
    if (bVar1) {
      if (2 < (int)gLogLevel) {
        uVar5 = std::__cxx11::string::c_str();
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
        ::operator->(local_60);
        uVar3 = std::__cxx11::string::c_str();
        fprintf((FILE *)__stream,"[ALSOFT] (II) Found %s = \"%s\"\n",uVar5,uVar3);
      }
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
      ::operator->(local_60);
      uVar4 = std::__cxx11::string::empty();
      local_8 = in_RCX;
      if ((uVar4 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
        ::operator->(local_60);
        local_8 = (char *)std::__cxx11::string::c_str();
      }
    }
    else if (in_RDI == (char *)0x0) {
      local_8 = in_RCX;
      if (2 < (int)gLogLevel) {
        __stream_00 = (FILE *)gLogFile;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(__stream_00,"[ALSOFT] (II) Key %s not found\n",uVar5);
        local_8 = in_RCX;
      }
    }
    else {
      local_8 = GetConfigValue(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    }
    std::__cxx11::string::~string(local_48);
  }
  return local_8;
}

Assistant:

const char *GetConfigValue(const char *devName, const char *blockName, const char *keyName, const char *def)
{
    if(!keyName)
        return def;

    std::string key;
    if(blockName && al::strcasecmp(blockName, "general") != 0)
    {
        key = blockName;
        if(devName)
        {
            key += '/';
            key += devName;
        }
        key += '/';
        key += keyName;
    }
    else
    {
        if(devName)
        {
            key = devName;
            key += '/';
        }
        key += keyName;
    }

    auto iter = std::find_if(ConfOpts.cbegin(), ConfOpts.cend(),
        [&key](const ConfigEntry &entry) -> bool
        { return entry.key == key; }
    );
    if(iter != ConfOpts.cend())
    {
        TRACE("Found %s = \"%s\"\n", key.c_str(), iter->value.c_str());
        if(!iter->value.empty())
            return iter->value.c_str();
        return def;
    }

    if(!devName)
    {
        TRACE("Key %s not found\n", key.c_str());
        return def;
    }
    return GetConfigValue(nullptr, blockName, keyName, def);
}